

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

bool __thiscall
glslang::HlslParseContext::isStructBufferMethod(HlslParseContext *this,TString *name)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(name,"GetDimensions");
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(name,"Load");
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (name,"Load2");
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (name,"Load3");
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(name,"Load4");
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(name,"Store");
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(name,"Store2");
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        compare(name,"Store3");
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::compare(name,"Store4");
                  if (iVar1 != 0) {
                    iVar1 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::compare(name,"InterlockedAdd");
                    if (iVar1 != 0) {
                      iVar1 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::compare(name,"InterlockedAnd");
                      if (iVar1 != 0) {
                        iVar1 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                ::compare(name,"InterlockedCompareExchange");
                        if (iVar1 != 0) {
                          iVar1 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                  ::compare(name,"InterlockedCompareStore");
                          if (iVar1 != 0) {
                            iVar1 = std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                    ::compare(name,"InterlockedExchange");
                            if (iVar1 != 0) {
                              iVar1 = std::__cxx11::
                                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      ::compare(name,"InterlockedMax");
                              if (iVar1 != 0) {
                                iVar1 = std::__cxx11::
                                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                        ::compare(name,"InterlockedMin");
                                if (iVar1 != 0) {
                                  iVar1 = std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                          ::compare(name,"InterlockedOr");
                                  if (iVar1 != 0) {
                                    iVar1 = std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::compare(name,"InterlockedXor");
                                    if (iVar1 != 0) {
                                      iVar1 = std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::compare(name,"IncrementCounter");
                                      if (iVar1 != 0) {
                                        iVar1 = std::__cxx11::
                                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                ::compare(name,"DecrementCounter");
                                        if (iVar1 != 0) {
                                          iVar1 = std::__cxx11::
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  ::compare(name,"Append");
                                          if (iVar1 != 0) {
                                            iVar1 = std::__cxx11::
                                                                                                        
                                                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                                  ::compare(name,"Consume");
                                            bVar2 = iVar1 == 0;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool HlslParseContext::isStructBufferMethod(const TString& name) const
{
    return
        name == "GetDimensions"              ||
        name == "Load"                       ||
        name == "Load2"                      ||
        name == "Load3"                      ||
        name == "Load4"                      ||
        name == "Store"                      ||
        name == "Store2"                     ||
        name == "Store3"                     ||
        name == "Store4"                     ||
        name == "InterlockedAdd"             ||
        name == "InterlockedAnd"             ||
        name == "InterlockedCompareExchange" ||
        name == "InterlockedCompareStore"    ||
        name == "InterlockedExchange"        ||
        name == "InterlockedMax"             ||
        name == "InterlockedMin"             ||
        name == "InterlockedOr"              ||
        name == "InterlockedXor"             ||
        name == "IncrementCounter"           ||
        name == "DecrementCounter"           ||
        name == "Append"                     ||
        name == "Consume";
}